

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O1

void __thiscall Nes_Apu::end_frame(Nes_Apu *this,cpu_time_t end_time)

{
  cpu_time_t *pcVar1;
  long lVar2;
  long lVar3;
  
  if (this->last_time < end_time) {
    run_until(this,end_time);
  }
  pcVar1 = &this->last_time;
  *pcVar1 = *pcVar1 - end_time;
  if (*pcVar1 < 0) {
    __assert_fail("( \"unmet requirement\", last_time >= 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xd2,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  if ((this->next_irq != 0x4000000000000000) &&
     (lVar2 = this->next_irq - end_time, this->next_irq = lVar2, lVar2 < 0)) {
    __assert_fail("next_irq >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xd6,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  lVar2 = (this->dmc).next_irq;
  if ((lVar2 != 0x4000000000000000) &&
     (lVar2 = lVar2 - end_time, (this->dmc).next_irq = lVar2, lVar2 < 0)) {
    __assert_fail("dmc.next_irq >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xda,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  if (this->earliest_irq_ != 0x4000000000000000) {
    lVar3 = this->earliest_irq_ - end_time;
    lVar2 = 0;
    if (0 < lVar3) {
      lVar2 = lVar3;
    }
    this->earliest_irq_ = lVar2;
  }
  return;
}

Assistant:

void Nes_Apu::end_frame( cpu_time_t end_time )
{
	if ( end_time > last_time )
		run_until( end_time );
	
	// make times relative to new frame
	last_time -= end_time;
	require( last_time >= 0 );
	
	if ( next_irq != no_irq ) {
		next_irq -= end_time;
		assert( next_irq >= 0 );
	}
	if ( dmc.next_irq != no_irq ) {
		dmc.next_irq -= end_time;
		assert( dmc.next_irq >= 0 );
	}
	if ( earliest_irq_ != no_irq ) {
		earliest_irq_ -= end_time;
		if ( earliest_irq_ < 0 )
			earliest_irq_ = 0;
	}
}